

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

lm_trie_quant_t * lm_trie_quant_create(int order)

{
  byte bVar1;
  lm_trie_quant_t *plVar2;
  size_t sVar3;
  float32 *pfVar4;
  lm_trie_quant_t *quant;
  float32 *pfStack_18;
  int i;
  float32 *start;
  int order_local;
  
  plVar2 = (lm_trie_quant_t *)
           __ckd_calloc__(1,0xa8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x83);
  sVar3 = quant_size(order);
  plVar2->nvalues = sVar3;
  pfVar4 = (float32 *)
           __ckd_calloc__(plVar2->nvalues,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x86);
  plVar2->values = pfVar4;
  plVar2->prob_bits = '\x10';
  plVar2->bo_bits = '\x10';
  plVar2->prob_mask = (1 << (plVar2->prob_bits & 0x1f)) - 1;
  plVar2->bo_mask = (1 << (plVar2->bo_bits & 0x1f)) - 1;
  pfStack_18 = plVar2->values;
  for (quant._4_4_ = 0; quant._4_4_ < order + -2; quant._4_4_ = quant._4_4_ + 1) {
    bins_create(plVar2->tables[quant._4_4_],plVar2->prob_bits,pfStack_18);
    bVar1 = plVar2->prob_bits;
    bins_create(plVar2->tables[quant._4_4_] + 1,plVar2->bo_bits,pfStack_18 + (1L << (bVar1 & 0x3f)))
    ;
    pfStack_18 = pfStack_18 + (1L << (bVar1 & 0x3f)) + (1L << (plVar2->bo_bits & 0x3f));
  }
  bins_create(plVar2->tables[order + -2],plVar2->prob_bits,pfStack_18);
  plVar2->longest = plVar2->tables[order + -2];
  return plVar2;
}

Assistant:

lm_trie_quant_t *
lm_trie_quant_create(int order)
{
    float32 *start;
    int i;
    lm_trie_quant_t *quant =
        (lm_trie_quant_t *) ckd_calloc(1, sizeof(*quant));
    quant->nvalues = quant_size(order);
    quant->values =
        (float32 *) ckd_calloc(quant->nvalues, sizeof(*quant->values));

    quant->prob_bits = 16;
    quant->bo_bits = 16;
    quant->prob_mask = (1U << quant->prob_bits) - 1;
    quant->bo_mask = (1U << quant->bo_bits) - 1;

    start = (float32 *) (quant->values);
    for (i = 0; i < order - 2; i++) {
        bins_create(&quant->tables[i][0], quant->prob_bits, start);
        start += (1ULL << quant->prob_bits);
        bins_create(&quant->tables[i][1], quant->bo_bits, start);
        start += (1ULL << quant->bo_bits);
    }
    bins_create(&quant->tables[order - 2][0], quant->prob_bits, start);
    quant->longest = &quant->tables[order - 2][0];
    return quant;
}